

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shellquote_shared.h
# Opt level: O1

QString * shellQuote(QString *__return_storage_ptr__,QString *arg)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  qsizetype qVar8;
  char16_t *pcVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  QString *ret;
  long in_FS_OFFSET;
  bool bVar13;
  QLatin1String QVar14;
  QByteArrayView QVar15;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = (arg->d).size;
  if (lVar11 == 0) {
    QVar15.m_data = (storage_type_conflict *)0x2;
    QVar15.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar15);
    qVar8 = local_28;
    uVar4 = (undefined4)local_38;
    uVar5 = local_38._4_4_;
    uVar6 = (undefined4)uStack_30;
    uVar7 = uStack_30._4_4_;
    local_38 = 0;
    uStack_30 = 0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar5;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar7;
    local_28 = 0;
    (__return_storage_ptr__->d).size = qVar8;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    pDVar2 = (arg->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (arg->d).ptr;
    (__return_storage_ptr__->d).size = lVar11;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar10 = (int)(__return_storage_ptr__->d).size - 1;
    bVar13 = -1 < (int)uVar10;
    if (bVar13) {
      pcVar9 = (__return_storage_ptr__->d).ptr;
      if (pcVar9 == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      bVar13 = true;
      lVar11 = (ulong)uVar10 + 1;
      do {
        cVar1 = pcVar9[lVar11 + -1];
        if (((ushort)cVar1 < 0x80) &&
           (((byte)shellQuoteUnix(QString_const&)::iqm[(ushort)cVar1 >> 3] >> (cVar1 & 7U) & 1) != 0
           )) break;
        bVar13 = 0 < lVar11 + -1;
        lVar12 = lVar11 + -1;
        bVar3 = 0 < lVar11;
        lVar11 = lVar12;
      } while (lVar12 != 0 && bVar3);
    }
    if (bVar13) {
      QVar14.m_data = &DAT_00000004;
      QVar14.m_size = 0x27;
      QString::replace((QChar)(char16_t)__return_storage_ptr__,QVar14,0x148177);
      QString::insert((longlong)__return_storage_ptr__,(QChar)0x0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QString::append((QChar)(char16_t)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      goto LAB_0010cc9f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_0010cc9f:
  __stack_chk_fail();
}

Assistant:

static QString shellQuote(const QString &arg)
{
    if (QDir::separator() == QLatin1Char('\\'))
        return shellQuoteWin(arg);
    else
        return shellQuoteUnix(arg);
}